

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::select_write(socket_t sock,time_t sec,time_t usec)

{
  anon_class_24_3_42bc4be6 fn;
  uint __i;
  long lVar1;
  ssize_t sVar2;
  timeval *in_stack_ffffffffffffff40;
  ulong local_b8;
  fd_set fds;
  timeval tv;
  socket_t sock_local;
  
  if (sock < 0x400) {
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      fds.fds_bits[lVar1 + -1] = 0;
    }
    fds.fds_bits[(long)(sock / 0x40) + -1] =
         fds.fds_bits[(long)(sock / 0x40) + -1] | 1L << ((byte)sock & 0x3f);
    fn.fds = (fd_set *)(fds.fds_bits + 0xf);
    fn.sock = (socket_t *)&local_b8;
    fn.tv = in_stack_ffffffffffffff40;
    fds.fds_bits[0xf] = sec;
    sVar2 = handle_EINTR<httplib::detail::select_write(int,long,long)::_lambda()_1_>(fn);
  }
  else {
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

inline ssize_t select_write(socket_t sock, time_t sec, time_t usec) {
        #ifdef CPPHTTPLIB_USE_POLL
            struct pollfd pfd_read;
            pfd_read.fd = sock;
            pfd_read.events = POLLOUT;

            auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

            return handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });
        #else
        #ifndef _WIN32
            if (sock >= FD_SETSIZE) { return 1; }
        #endif

            fd_set fds;
            FD_ZERO(&fds);
            FD_SET(sock, &fds);

            timeval tv;
            tv.tv_sec = static_cast<long>(sec);
            tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

            return handle_EINTR([&]() {
                return select(static_cast<int>(sock + 1), nullptr, &fds, nullptr, &tv);
            });
        #endif
        }